

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_3)

{
  compressed_sparse_matrix<int> *this_00;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  filtered_directed_graph_t *pfVar4;
  pair<int,_float> *ppVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  ulong uVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  ulong local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  ushort *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  directed_flag_complex_coboundary_cell_t local_50;
  
  if ((this->is_first == true) &&
     (uVar1 = this->current_index * 0x3afb7e91 + 0x3b2fec51,
     (uVar1 >> 4 | uVar1 * 0x10000000) < 0x68db9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dimension ",10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->current_dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": computed ca. ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if (this->total_cell_number != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," coboundaries",0xd);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r",1);
  }
  compressed_sparse_matrix<int>::append_column(this->coboundary_matrix);
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  if (0 < size) {
    uVar6 = 0;
    do {
      local_58 = (ulong)(first_vertex[uVar6] >> 6);
      if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_58);
      }
      else {
        *local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_58;
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)size != uVar6);
  }
  if (-1 < size) {
    local_78 = (ulong)(size + 1);
    local_b0 = 0;
    local_80 = first_vertex;
    do {
      pfVar4 = this->graph;
      uVar6 = (pfVar4->super_directed_graph_t).incidence_row_length;
      if (uVar6 != 0) {
        local_68 = local_b0 & 0xffff;
        uVar10 = 0;
        do {
          if (size == 0) {
            uVar7 = 0xffffffffffffffff;
          }
          else {
            uVar7 = 0xffffffffffffffff;
            uVar8 = 0;
            do {
              if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8] == uVar10) {
                uVar7 = uVar7 & ~(1L << ((ulong)(byte)first_vertex[uVar8] & 0x3f));
              }
              pvVar9 = &(pfVar4->super_directed_graph_t).incidence_incoming;
              if (uVar8 < local_b0) {
                pvVar9 = &(pfVar4->super_directed_graph_t).incidence_outgoing;
              }
              uVar7 = uVar7 & (pvVar9->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [first_vertex[uVar8] * uVar6 + uVar10];
            } while ((uVar7 != 0) && (uVar8 = uVar8 + 1, uVar8 < (uint)size));
          }
          local_60 = uVar10 << 6;
          local_70 = uVar10;
          for (; uVar7 != 0; uVar7 = uVar7 & ~(1L << (uVar6 & 0x3f))) {
            uVar6 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar2 = (uint)uVar6 | (uint)local_60;
            uVar1 = uVar2;
            if ((short)local_b0 != 0) {
              uVar1 = (uint)*local_80;
            }
            uVar10 = this->nb_threads;
            this_00 = this->coboundary_matrix;
            local_50.super_directed_flag_complex_cell_t.vertices = local_80;
            local_50.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
                 (_func_int **)&PTR_vertex_00151248;
            local_50._insert_position = local_68;
            local_50._insert_vertex = (vertex_index_t)uVar2;
            ppVar5 = directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
                     get_data<directed_flag_complex_coboundary_cell_t>
                               (this->complex,this->current_dimension + 1,&local_50);
            compressed_sparse_matrix<int>::push_back
                      (this_00,ppVar5->first +
                               (int)(this->cell_index_offsets->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(short)((ulong)(uVar1 & 0xffff) % uVar10)]);
          }
          uVar10 = local_70 + 1;
          pfVar4 = this->graph;
          uVar6 = (pfVar4->super_directed_graph_t).incidence_row_length;
          first_vertex = local_80;
        } while (uVar10 < uVar6);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != local_78);
  }
  this->current_index = this->current_index + 1;
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					auto cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					short thread_index = cb.vertex(0) % nb_threads;
					coboundary_matrix.push_back(make_entry(complex.get_data(current_dimension + 1, cb).first +
					                                           index_t(cell_index_offsets[thread_index]),
					                                       index_t(i & 1 ? -1 + modulus : 1)));
				}
			}
		}

		current_index++;
	}